

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::read_xref(QPDF *this,qpdf_offset_t xref_offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  size_type sVar6;
  QPDFExc *pQVar7;
  pointer this_00;
  reference __b;
  _Rb_tree_color *p_Var8;
  reference this_01;
  pair<std::_Rb_tree_const_iterator<long_long>,_bool> pVar9;
  int local_440;
  int local_43c;
  int id;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *item;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  QPDFObjGen last_og;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<char> local_301;
  string local_300;
  QPDFExc local_2e0;
  undefined1 local_260 [16];
  _Rb_tree_color local_250;
  allocator<char> local_249;
  int max_obj;
  QPDFObjectHandle local_228;
  int local_218;
  undefined1 local_212;
  allocator<char> local_211;
  int size;
  allocator<char> local_1e9;
  string local_1e8;
  undefined1 local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  int local_178;
  allocator<char> local_171;
  int skip;
  allocator<char> local_149;
  string local_148;
  QPDFExc local_128;
  char local_a3;
  byte local_a2;
  byte local_a1;
  char local_a0 [5];
  char ch;
  bool skipped_space;
  bool done;
  char buf [7];
  undefined1 local_78 [8];
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> visited;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> free_table;
  qpdf_offset_t xref_offset_local;
  QPDF *this_local;
  
  free_table._M_t._M_impl.super__Rb_tree_header._M_node_count = xref_offset;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::set
            ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_78);
  do {
    if (free_table._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar4->trailer).super_BaseHandle);
      if (bVar1) {
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&max_obj,"/Size",&local_249);
        QPDFObjectHandle::getKey(&local_228,(string *)&pMVar4->trailer);
        iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_228);
        QPDFObjectHandle::~QPDFObjectHandle(&local_228);
        std::__cxx11::string::~string((string *)&max_obj);
        std::allocator<char>::~allocator(&local_249);
        local_250 = _S_red;
        local_218 = iVar2;
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        bVar1 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::empty(&pMVar4->xref_table);
        if (!bVar1) {
          std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m);
          std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::rbegin((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                    *)(local_260 + 8));
          this_00 = std::
                    reverse_iterator<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                    ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                                  *)(local_260 + 8));
          local_250 = QPDFObjGen::getObj(&this_00->first);
        }
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(&pMVar4->deleted_objects)
        ;
        if (!bVar1) {
          std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m);
          std::set<int,_std::less<int>,_std::allocator<int>_>::rbegin
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_260);
          __b = std::reverse_iterator<std::_Rb_tree_const_iterator<int>_>::operator*
                          ((reverse_iterator<std::_Rb_tree_const_iterator<int>_> *)local_260);
          p_Var8 = (_Rb_tree_color *)std::max<int>((int *)&local_250,__b);
          local_250 = *p_Var8;
        }
        if ((local_218 < 1) || (local_218 - _S_black != local_250)) {
          QTC::TC("qpdf","QPDF xref size mismatch",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"",&local_301);
          std::__cxx11::to_string(&local_3a8,local_218);
          std::operator+(&local_388,"reported number of objects (",&local_3a8);
          std::operator+(&local_368,&local_388,") is not one plus the highest object number (");
          std::__cxx11::to_string((string *)&last_og,local_250);
          std::operator+(&local_348,&local_368,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &last_og);
          std::operator+(&local_328,&local_348,")");
          damagedPDF(&local_2e0,this,&local_300,-1,&local_328);
          warn(this,&local_2e0);
          QPDFExc::~QPDFExc(&local_2e0);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&last_og);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator(&local_301);
        }
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&pMVar4->deleted_objects);
        QPDFObjGen::QPDFObjGen((QPDFObjGen *)&__range1,-1,0);
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        __end1 = std::
                 map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                 ::begin(&pMVar4->xref_table);
        item = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
               std::
               map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
               ::end(&pMVar4->xref_table);
        while (bVar1 = std::operator!=(&__end1,(_Self *)&item), bVar1) {
          this_01 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*
                              (&__end1);
          iVar2 = QPDFObjGen::getObj(&this_01->first);
          iVar3 = QPDFObjGen::getObj((QPDFObjGen *)&__range1);
          if ((iVar2 == iVar3) && (0 < iVar2)) {
            removeObject(this,(QPDFObjGen)__range1);
          }
          __range1 = *(map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                       **)&this_01->first;
          std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
        }
        std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
                  ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_78);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
        return;
      }
      local_212 = 1;
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&size,"unable to find trailer while reading xref",&local_211);
      damagedPDF(pQVar7,this,&local_1e8,-1,(string *)&size);
      local_212 = 0;
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pVar9 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::insert
                      ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_78,
                       (value_type_conflict2 *)
                       &free_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
    _buf = pVar9.first._M_node;
    local_a0[4] = '\0';
    _ch = 0;
    local_a0[0] = '\0';
    local_a0[1] = '\0';
    local_a0[2] = '\0';
    local_a0[3] = '\0';
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar4->file);
    (*peVar5->_vptr_InputSource[5])
              (peVar5,free_table._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    local_a1 = 0;
    local_a2 = 0;
    while (((local_a1 ^ 0xff) & 1) != 0) {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar4->file);
      iVar2 = (*peVar5->_vptr_InputSource[7])(peVar5,&local_a3,1);
      if (CONCAT44(extraout_var,iVar2) == 1) {
        bVar1 = ::qpdf::util::is_space(local_a3);
        if (bVar1) {
          local_a2 = 1;
        }
        else {
          pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar4->file);
          (*peVar5->_vptr_InputSource[8])(peVar5,(ulong)(uint)(int)local_a3);
          local_a1 = 1;
        }
      }
      else {
        QTC::TC("qpdf","QPDF eof skipping spaces before xref",(byte)~local_a2 & 1);
        local_a1 = 1;
      }
    }
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar4->file);
    (*peVar5->_vptr_InputSource[7])(peVar5,local_a0,6);
    iVar2 = strncmp(local_a0,"xref",4);
    if ((iVar2 == 0) && (bVar1 = ::qpdf::util::is_space(local_a0[4]), bVar1)) {
      if ((local_a2 & 1) != 0) {
        QTC::TC("qpdf","QPDF xref skipped space",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&skip,"extraneous whitespace seen before xref",&local_171);
        damagedPDF(&local_128,this,&local_148,-1,(string *)&skip);
        warn(this,&local_128);
        QPDFExc::~QPDFExc(&local_128);
        std::__cxx11::string::~string((string *)&skip);
        std::allocator<char>::~allocator(&local_171);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
      }
      if (local_a0[4] == '\n') {
        local_43c = 0;
      }
      else {
        if (local_a0[4] == '\r') {
          local_440 = 1;
        }
        else {
          local_440 = 9999;
          if (local_a0[4] == ' ') {
            local_440 = 2;
          }
        }
        local_43c = local_440;
      }
      QTC::TC("qpdf","QPDF xref space",local_43c);
      local_178 = 4;
      while (bVar1 = ::qpdf::util::is_space(local_a0[local_178]), bVar1) {
        local_178 = local_178 + 1;
      }
      free_table._M_t._M_impl.super__Rb_tree_header._M_node_count =
           read_xrefTable(this,free_table._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               (long)local_178);
    }
    else {
      free_table._M_t._M_impl.super__Rb_tree_header._M_node_count =
           read_xrefStream(this,free_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    sVar6 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::count
                      ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_78,
                       (key_type_conflict1 *)
                       &free_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  } while (sVar6 == 0);
  QTC::TC("qpdf","QPDF xref loop",0);
  local_1c2 = 1;
  pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"loop detected following xref tables",&local_1c1);
  damagedPDF(pQVar7,this,&local_198,-1,&local_1c0);
  local_1c2 = 0;
  __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::read_xref(qpdf_offset_t xref_offset)
{
    std::map<int, int> free_table;
    std::set<qpdf_offset_t> visited;
    while (xref_offset) {
        visited.insert(xref_offset);
        char buf[7];
        memset(buf, 0, sizeof(buf));
        m->file->seek(xref_offset, SEEK_SET);
        // Some files miss the mark a little with startxref. We could do a better job of searching
        // in the neighborhood for something that looks like either an xref table or stream, but the
        // simple heuristic of skipping whitespace can help with the xref table case and is harmless
        // with the stream case.
        bool done = false;
        bool skipped_space = false;
        while (!done) {
            char ch;
            if (1 == m->file->read(&ch, 1)) {
                if (util::is_space(ch)) {
                    skipped_space = true;
                } else {
                    m->file->unreadCh(ch);
                    done = true;
                }
            } else {
                QTC::TC("qpdf", "QPDF eof skipping spaces before xref", skipped_space ? 0 : 1);
                done = true;
            }
        }

        m->file->read(buf, sizeof(buf) - 1);
        // The PDF spec says xref must be followed by a line terminator, but files exist in the wild
        // where it is terminated by arbitrary whitespace.
        if ((strncmp(buf, "xref", 4) == 0) && util::is_space(buf[4])) {
            if (skipped_space) {
                QTC::TC("qpdf", "QPDF xref skipped space");
                warn(damagedPDF("", -1, "extraneous whitespace seen before xref"));
            }
            QTC::TC(
                "qpdf",
                "QPDF xref space",
                ((buf[4] == '\n')       ? 0
                     : (buf[4] == '\r') ? 1
                     : (buf[4] == ' ')  ? 2
                                        : 9999));
            int skip = 4;
            // buf is null-terminated, and util::is_space('\0') is false, so this won't overrun.
            while (util::is_space(buf[skip])) {
                ++skip;
            }
            xref_offset = read_xrefTable(xref_offset + skip);
        } else {
            xref_offset = read_xrefStream(xref_offset);
        }
        if (visited.count(xref_offset) != 0) {
            QTC::TC("qpdf", "QPDF xref loop");
            throw damagedPDF("", -1, "loop detected following xref tables");
        }
    }

    if (!m->trailer) {
        throw damagedPDF("", -1, "unable to find trailer while reading xref");
    }
    int size = m->trailer.getKey("/Size").getIntValueAsInt();
    int max_obj = 0;
    if (!m->xref_table.empty()) {
        max_obj = m->xref_table.rbegin()->first.getObj();
    }
    if (!m->deleted_objects.empty()) {
        max_obj = std::max(max_obj, *(m->deleted_objects.rbegin()));
    }
    if ((size < 1) || (size - 1 != max_obj)) {
        QTC::TC("qpdf", "QPDF xref size mismatch");
        warn(damagedPDF(
            "",
            -1,
            ("reported number of objects (" + std::to_string(size) +
             ") is not one plus the highest object number (" + std::to_string(max_obj) + ")")));
    }

    // We no longer need the deleted_objects table, so go ahead and clear it out to make sure we
    // never depend on its being set.
    m->deleted_objects.clear();

    // Make sure we keep only the highest generation for any object.
    QPDFObjGen last_og{-1, 0};
    for (auto const& item: m->xref_table) {
        auto id = item.first.getObj();
        if (id == last_og.getObj() && id > 0) {
            removeObject(last_og);
        }
        last_og = item.first;
    }
}